

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LR.cpp
# Opt level: O0

void __thiscall
lr_grammar::GrammarLR::update_elem
          (GrammarLR *this,int elemIndex,int begin,int end,
          vector<int,_std::allocator<int>_> *factory)

{
  int iVar1;
  size_type sVar2;
  reference pvVar3;
  reference pvVar4;
  size_type sVar5;
  ulong uVar6;
  Express *pEVar7;
  int *piVar8;
  reference __x;
  reference this_00;
  int local_268;
  int local_264;
  int i_4;
  int i_3;
  int moveDistance;
  int i_2;
  int local_240;
  int local_23c;
  int j;
  int i_1;
  int local_220;
  value_type local_21c;
  int i;
  vector<int,_std::allocator<int>_> t;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0 [32];
  int local_1c0 [2];
  int newIndex;
  stringstream local_1b0 [8];
  stringstream ss;
  ostream local_1a0 [376];
  vector<int,_std::allocator<int>_> *local_28;
  vector<int,_std::allocator<int>_> *factory_local;
  int local_18;
  int end_local;
  int begin_local;
  int elemIndex_local;
  GrammarLR *this_local;
  
  local_28 = factory;
  factory_local._4_4_ = end;
  local_18 = begin;
  end_local = elemIndex;
  _begin_local = this;
  std::__cxx11::stringstream::stringstream(local_1b0);
  sVar2 = std::vector<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>::size
                    (&this->elements);
  std::ostream::operator<<(local_1a0,sVar2);
  pvVar3 = std::vector<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>::operator[]
                     (&this->elements,(long)end_local);
  std::__cxx11::stringstream::str();
  std::operator+(local_1e0,&(pvVar3->super_Elem).name);
  iVar1 = add_elem(this,local_1e0,false);
  std::__cxx11::string::~string((string *)local_1e0);
  std::__cxx11::string::~string
            ((string *)
             &t.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  local_1c0[0] = iVar1;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)&i);
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)&i);
  pvVar3 = std::vector<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>::operator[]
                     (&this->elements,(long)end_local);
  pvVar4 = std::vector<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>::operator[]
                     (&pvVar3->expression_of_set,(long)local_18);
  sVar2 = std::vector<int,_std::allocator<int>_>::size((vector<int,_std::allocator<int>_> *)pvVar4);
  sVar5 = std::vector<int,_std::allocator<int>_>::size(local_28);
  if (sVar2 == sVar5) {
    local_21c = -1;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)&i,&local_21c);
  }
  else {
    sVar2 = std::vector<int,_std::allocator<int>_>::size(local_28);
    local_220 = (int)sVar2;
    while( true ) {
      uVar6 = (ulong)local_220;
      pvVar3 = std::vector<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>::
               operator[](&this->elements,(long)end_local);
      pvVar4 = std::vector<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>::
               operator[](&pvVar3->expression_of_set,(long)local_18);
      sVar2 = std::vector<int,_std::allocator<int>_>::size
                        ((vector<int,_std::allocator<int>_> *)pvVar4);
      if (sVar2 <= uVar6) break;
      pvVar3 = std::vector<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>::
               operator[](&this->elements,(long)end_local);
      pEVar7 = &std::vector<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>::
                operator[](&pvVar3->expression_of_set,(long)local_18)->super_Express;
      piVar8 = base_grammar::Express::operator[](pEVar7,local_220);
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)&i,piVar8);
      local_220 = local_220 + 1;
    }
  }
  pvVar3 = std::vector<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>::operator[]
                     (&this->elements,(long)local_1c0[0]);
  ExpressLR::ExpressLR((ExpressLR *)&j,(vector<int,_std::allocator<int>_> *)&i);
  ElemRight::add_expression(pvVar3,(ExpressLR *)&j);
  ExpressLR::~ExpressLR((ExpressLR *)&j);
  local_23c = local_18;
  while (local_23c = local_23c + 1, local_23c < factory_local._4_4_) {
    std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)&i);
    sVar2 = std::vector<int,_std::allocator<int>_>::size(local_28);
    local_240 = (int)sVar2;
    while( true ) {
      uVar6 = (ulong)local_240;
      pvVar3 = std::vector<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>::
               operator[](&this->elements,(long)end_local);
      pvVar4 = std::vector<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>::
               operator[](&pvVar3->expression_of_set,(long)local_23c);
      sVar2 = std::vector<int,_std::allocator<int>_>::size
                        ((vector<int,_std::allocator<int>_> *)pvVar4);
      if (sVar2 <= uVar6) break;
      pvVar3 = std::vector<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>::
               operator[](&this->elements,(long)end_local);
      pEVar7 = &std::vector<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>::
                operator[](&pvVar3->expression_of_set,(long)local_23c)->super_Express;
      piVar8 = base_grammar::Express::operator[](pEVar7,local_240);
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)&i,piVar8);
      local_240 = local_240 + 1;
    }
    pvVar3 = std::vector<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>::operator[]
                       (&this->elements,(long)local_1c0[0]);
    ExpressLR::ExpressLR((ExpressLR *)&moveDistance,(vector<int,_std::allocator<int>_> *)&i);
    ElemRight::add_expression(pvVar3,(ExpressLR *)&moveDistance);
    ExpressLR::~ExpressLR((ExpressLR *)&moveDistance);
  }
  pvVar3 = std::vector<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>::operator[]
                     (&this->elements,(long)end_local);
  pvVar4 = std::vector<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>::operator[]
                     (&pvVar3->expression_of_set,(long)local_18);
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)pvVar4);
  for (i_3 = 0; sVar2 = std::vector<int,_std::allocator<int>_>::size(local_28),
      (ulong)(long)i_3 < sVar2; i_3 = i_3 + 1) {
    pvVar3 = std::vector<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>::operator[]
                       (&this->elements,(long)end_local);
    pvVar4 = std::vector<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>::operator[]
                       (&pvVar3->expression_of_set,(long)local_18);
    __x = std::vector<int,_std::allocator<int>_>::operator[](local_28,(long)i_3);
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)pvVar4,__x);
  }
  pvVar3 = std::vector<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>::operator[]
                     (&this->elements,(long)end_local);
  pvVar4 = std::vector<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>::operator[]
                     (&pvVar3->expression_of_set,(long)local_18);
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)pvVar4,local_1c0);
  iVar1 = factory_local._4_4_ - local_18;
  local_264 = factory_local._4_4_;
  while( true ) {
    pvVar3 = std::vector<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>::operator[]
                       (&this->elements,(long)end_local);
    sVar2 = std::vector<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>::size
                      (&pvVar3->expression_of_set);
    if (sVar2 <= (ulong)(long)local_264) break;
    pvVar3 = std::vector<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>::operator[]
                       (&this->elements,(long)end_local);
    pvVar4 = std::vector<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>::operator[]
                       (&pvVar3->expression_of_set,(long)local_264);
    pvVar3 = std::vector<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>::operator[]
                       (&this->elements,(long)end_local);
    this_00 = std::vector<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>::operator[]
                        (&pvVar3->expression_of_set,(long)((local_264 - iVar1) + 1));
    ExpressLR::operator=(this_00,pvVar4);
    local_264 = local_264 + 1;
  }
  for (local_268 = 0; local_268 < iVar1 + -1; local_268 = local_268 + 1) {
    pvVar3 = std::vector<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>::operator[]
                       (&this->elements,(long)end_local);
    std::vector<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>::pop_back
              (&pvVar3->expression_of_set);
  }
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&i);
  std::__cxx11::stringstream::~stringstream(local_1b0);
  return;
}

Assistant:

void GrammarLR::update_elem(int elemIndex, int begin, int end, vector<int>& factory){


    stringstream ss;
    ss << elements.size();
    int newIndex = add_elem(elements[elemIndex].name + ss.str(), false);

    //先对新的式子添加表达式,将begin到end添加的
    //产生空串的只有第一个begin有这个倾向，别的没有这个倾向,将begin单独拿出来作为特例
    vector<int> t;
    t.clear();
    if (elements[elemIndex].expression_of_set[begin].expression.size() == factory.size()){
        t.push_back(-1);
    }
    else
    {
        for (int i = factory.size(); i < elements[elemIndex].expression_of_set[begin].expression.size(); i++){
            t.push_back(elements[elemIndex].expression_of_set[begin][i]);
        }
    }
    elements[newIndex].add_expression(t);

    for (int i = begin + 1; i < end; i++){
        t.clear();
        for (int j = factory.size(); j < elements[elemIndex].expression_of_set[i].expression.size(); j++){
            t.push_back(elements[elemIndex].expression_of_set[i][j]);
        }
        elements[newIndex].add_expression(t);
    }


    //修改老元素了
    //1. 在begin下面放下结果
    elements[elemIndex].expression_of_set[begin].expression.clear();
    for (int i = 0; i < factory.size(); i++){
        elements[elemIndex].expression_of_set[begin].expression.push_back(factory[i]);
    }
    elements[elemIndex].expression_of_set[begin].expression.push_back(newIndex);

    //后面的元素提前
    int moveDistance = end - begin;
    for (int i = end; i < elements[elemIndex].expression_of_set.size(); i++){
        elements[elemIndex].expression_of_set[i - moveDistance + 1] = elements[elemIndex].expression_of_set[i];
    }

    //清楚元素，共清楚moveDistance-1个
    for (int i = 0; i < moveDistance - 1; i++){
        elements[elemIndex].expression_of_set.pop_back();
    }
}